

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  stbi_uc *psVar6;
  char *pcVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  stbi_uc *psVar18;
  uint uVar19;
  uint uVar20;
  long lVar22;
  ulong uVar23;
  stbi_uc *psVar24;
  uint uVar25;
  int iVar26;
  byte *pbVar27;
  byte bVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  stbi_uc *psVar34;
  byte *pbVar35;
  long lVar36;
  long in_FS_OFFSET;
  bool bVar37;
  ulong local_68;
  ulong uVar21;
  
  bVar37 = depth == 0x10;
  uVar2 = x * out_n;
  uVar3 = uVar2 << bVar37;
  a_00 = a->s->img_n;
  uVar4 = a_00 << bVar37;
  iVar11 = a_00 + 1;
  if (iVar11 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                  ,0x11c8,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar6 = (stbi_uc *)
           stbi__malloc_mad3(x,y,out_n << bVar37,
                             CONCAT31((int3)((uint)iVar11 >> 8),iVar11 == out_n || a_00 == out_n));
  a->out = psVar6;
  if (psVar6 == (stbi_uc *)0x0) {
    pcVar7 = "outofmem";
  }
  else {
    iVar5 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar5 == 0) {
      pcVar7 = "too large";
    }
    else {
      uVar12 = a_00 * x;
      uVar20 = uVar12 * depth + 7 >> 3;
      uVar21 = (ulong)uVar20;
      if (raw_len < (uVar20 + 1) * y) {
        pcVar7 = "not enough pixels";
      }
      else {
        if (y == 0) {
joined_r0x0014461a:
          if (depth != 0x10) {
            return 1;
          }
LAB_0014461c:
          if (uVar2 * y == 0) {
            return 1;
          }
          psVar6 = a->out;
          lVar14 = 0;
          do {
            puVar1 = (ushort *)(psVar6 + lVar14 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar14 = lVar14 + 1;
          } while (uVar2 * y != (int)lVar14);
          return 1;
        }
        bVar10 = *raw;
        if (bVar10 < 5) {
          lVar14 = (long)a_00;
          lVar15 = (long)(out_n << bVar37);
          iVar5 = x - 1;
          uVar8 = (ulong)y;
          psVar6 = a->out;
          lVar16 = -lVar15;
          lVar30 = -(ulong)uVar3;
          uVar31 = 0;
          lVar36 = 0;
          local_68 = (ulong)x;
          do {
            if (depth < 8) {
              if (x < uVar20) {
                pcVar7 = "invalid width";
                goto LAB_001445ed;
              }
              psVar6 = psVar6 + (uVar2 - uVar20);
              uVar4 = 1;
              local_68 = uVar21;
            }
            if (lVar36 == 0) {
              bVar10 = ""[bVar10];
            }
            if (0 < (int)uVar4) {
              uVar23 = 0;
              do {
                switch(bVar10) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar9 = raw[uVar23 + 1];
                  goto LAB_0014475c;
                case 2:
                case 4:
                  bVar9 = psVar6[uVar23 + lVar30];
                  break;
                case 3:
                  bVar9 = psVar6[uVar23 + lVar30] >> 1;
                  break;
                default:
                  goto switchD_00144744_default;
                }
                bVar9 = bVar9 + raw[uVar23 + 1];
LAB_0014475c:
                psVar6[uVar23] = bVar9;
switchD_00144744_default:
                uVar23 = uVar23 + 1;
              } while (uVar4 != uVar23);
            }
            if (depth == 8) {
              lVar22 = (long)out_n;
              lVar17 = lVar14;
              if (a_00 != out_n) {
                psVar6[lVar14] = 0xff;
              }
LAB_001447b9:
              raw = raw + lVar17 + 1;
            }
            else {
              if (depth == 0x10) {
                lVar17 = (long)(int)uVar4;
                lVar22 = lVar15;
                if (a_00 != out_n) {
                  psVar6[lVar17] = 0xff;
                  psVar6[lVar17 + 1] = 0xff;
                }
                goto LAB_001447b9;
              }
              raw = raw + 2;
              lVar22 = 1;
            }
            psVar34 = psVar6 + lVar22;
            if (depth < 8 || a_00 == out_n) {
              uVar13 = ((int)local_68 + -1) * uVar4;
              switch(bVar10) {
              case 0:
                memcpy(psVar34,raw,(long)(int)uVar13);
                break;
              case 1:
                if (0 < (int)uVar13) {
                  uVar31 = 0;
                  do {
                    psVar34[uVar31] = psVar6[uVar31 + (lVar22 - (int)uVar4)] + raw[uVar31];
                    uVar31 = uVar31 + 1;
                  } while (uVar13 != uVar31);
                }
                break;
              case 2:
                if (0 < (int)uVar13) {
                  uVar31 = 0;
                  do {
                    psVar34[uVar31] = psVar34[uVar31 + lVar30] + raw[uVar31];
                    uVar31 = uVar31 + 1;
                  } while (uVar13 != uVar31);
                }
                break;
              case 3:
                if (0 < (int)uVar13) {
                  uVar31 = 0;
                  do {
                    psVar34[uVar31] =
                         (char)((uint)psVar6[uVar31 + (lVar22 - (int)uVar4)] +
                                (uint)psVar34[uVar31 + lVar30] >> 1) + raw[uVar31];
                    uVar31 = uVar31 + 1;
                  } while (uVar13 != uVar31);
                }
                break;
              case 4:
                if (0 < (int)uVar13) {
                  pbVar35 = psVar6 + (lVar22 - (int)uVar4);
                  uVar31 = 0;
                  do {
                    bVar10 = *pbVar35;
                    bVar9 = psVar34[lVar30];
                    bVar28 = pbVar35[lVar30];
                    iVar32 = ((uint)bVar9 + (uint)bVar10) - (uint)bVar28;
                    uVar25 = iVar32 - (uint)bVar10;
                    uVar19 = -uVar25;
                    if (0 < (int)uVar25) {
                      uVar19 = uVar25;
                    }
                    uVar29 = iVar32 - (uint)bVar9;
                    uVar25 = -uVar29;
                    if (0 < (int)uVar29) {
                      uVar25 = uVar29;
                    }
                    uVar33 = iVar32 - (uint)bVar28;
                    uVar29 = -uVar33;
                    if (0 < (int)uVar33) {
                      uVar29 = uVar33;
                    }
                    if (uVar25 <= uVar29) {
                      bVar28 = bVar9;
                    }
                    if (uVar29 < uVar19) {
                      bVar10 = bVar28;
                    }
                    if (uVar25 < uVar19) {
                      bVar10 = bVar28;
                    }
                    *psVar34 = bVar10 + raw[uVar31];
                    uVar31 = uVar31 + 1;
                    pbVar35 = pbVar35 + 1;
                    psVar34 = psVar34 + 1;
                  } while (uVar13 != uVar31);
                }
                break;
              case 5:
                if (0 < (int)uVar13) {
                  uVar31 = 0;
                  do {
                    psVar34[uVar31] = (psVar6[uVar31 + (lVar22 - (int)uVar4)] >> 1) + raw[uVar31];
                    uVar31 = uVar31 + 1;
                  } while (uVar13 != uVar31);
                }
                break;
              case 6:
                if (0 < (int)uVar13) {
                  uVar31 = 0;
                  do {
                    psVar34[uVar31] = psVar6[uVar31 + (lVar22 - (int)uVar4)] + raw[uVar31];
                    uVar31 = uVar31 + 1;
                  } while (uVar13 != uVar31);
                }
              }
              raw = raw + (int)uVar13;
LAB_00144d06:
              if (lVar36 + 1U == uVar8) {
                if (depth < 8) {
                  if (y == 0) {
                    return 1;
                  }
                  uVar20 = x - 1;
                  lVar14 = uVar2 - uVar21;
                  lVar15 = (ulong)uVar20 + 1;
                  uVar4 = 0;
                  uVar31 = 0;
                  do {
                    bVar10 = 1;
                    if (color == 0) {
                      bVar10 = ""[depth];
                    }
                    psVar6 = a->out;
                    pbVar27 = psVar6 + uVar3 * (int)uVar31;
                    pbVar35 = pbVar27 + (uVar2 - uVar21);
                    uVar23 = (ulong)uVar4;
                    if (depth == 4) {
                      uVar13 = uVar12;
                      if (1 < (int)uVar12) {
                        psVar34 = psVar6 + lVar14;
                        uVar19 = uVar12;
                        do {
                          psVar6[uVar23] = (psVar34[uVar23] >> 4) * bVar10;
                          psVar6[uVar23 + 1] = (psVar34[uVar23] & 0xf) * bVar10;
                          uVar13 = uVar19 - 2;
                          psVar34 = psVar34 + 1;
                          psVar6 = psVar6 + 2;
                          bVar37 = 3 < uVar19;
                          uVar19 = uVar13;
                        } while (bVar37);
                        pbVar35 = psVar34 + uVar23;
                        pbVar27 = psVar6 + uVar23;
                      }
                      if (uVar13 == 1) {
                        *pbVar27 = (*pbVar35 >> 4) * bVar10;
                      }
                    }
                    else if (depth == 2) {
                      uVar13 = uVar12;
                      if (3 < (int)uVar12) {
                        psVar34 = psVar6 + lVar14;
                        uVar19 = uVar12;
                        do {
                          psVar6[uVar23] = (psVar34[uVar23] >> 6) * bVar10;
                          psVar6[uVar23 + 1] = (psVar34[uVar23] >> 4 & 3) * bVar10;
                          psVar6[uVar23 + 2] = (psVar34[uVar23] >> 2 & 3) * bVar10;
                          psVar6[uVar23 + 3] = (psVar34[uVar23] & 3) * bVar10;
                          uVar13 = uVar19 - 4;
                          psVar34 = psVar34 + 1;
                          psVar6 = psVar6 + 4;
                          bVar37 = 7 < uVar19;
                          uVar19 = uVar13;
                        } while (bVar37);
                        pbVar35 = psVar34 + uVar23;
                        pbVar27 = psVar6 + uVar23;
                      }
                      if (((0 < (int)uVar13) && (*pbVar27 = (*pbVar35 >> 6) * bVar10, uVar13 != 1))
                         && (pbVar27[1] = (*pbVar35 >> 4 & 3) * bVar10, uVar13 == 3)) {
                        pbVar27[2] = (*pbVar35 >> 2 & 3) * bVar10;
                      }
                    }
                    else if (depth == 1) {
                      uVar13 = uVar12;
                      if (7 < (int)uVar12) {
                        psVar34 = psVar6 + lVar14;
                        uVar19 = uVar12;
                        do {
                          psVar6[uVar23] = (char)psVar34[uVar23] >> 7 & bVar10;
                          psVar6[uVar23 + 1] = (char)(psVar34[uVar23] * '\x02') >> 7 & bVar10;
                          psVar6[uVar23 + 2] = (char)(psVar34[uVar23] << 2) >> 7 & bVar10;
                          psVar6[uVar23 + 3] = (char)(psVar34[uVar23] << 3) >> 7 & bVar10;
                          psVar6[uVar23 + 4] = (char)(psVar34[uVar23] << 4) >> 7 & bVar10;
                          psVar6[uVar23 + 5] = (char)(psVar34[uVar23] << 5) >> 7 & bVar10;
                          psVar6[uVar23 + 6] = (char)(psVar34[uVar23] << 6) >> 7 & bVar10;
                          bVar9 = bVar10;
                          if ((psVar34[uVar23] & 1) == 0) {
                            bVar9 = 0;
                          }
                          psVar6[uVar23 + 7] = bVar9;
                          uVar13 = uVar19 - 8;
                          psVar34 = psVar34 + 1;
                          psVar6 = psVar6 + 8;
                          bVar37 = 0xf < uVar19;
                          uVar19 = uVar13;
                        } while (bVar37);
                        pbVar35 = psVar34 + uVar23;
                        pbVar27 = psVar6 + uVar23;
                      }
                      if (((((0 < (int)uVar13) &&
                            (*pbVar27 = (char)*pbVar35 >> 7 & bVar10, uVar13 != 1)) &&
                           ((pbVar27[1] = (char)(*pbVar35 * '\x02') >> 7 & bVar10, 2 < uVar13 &&
                            ((pbVar27[2] = (char)(*pbVar35 << 2) >> 7 & bVar10, uVar13 != 3 &&
                             (pbVar27[3] = (char)(*pbVar35 << 3) >> 7 & bVar10, 4 < uVar13)))))) &&
                          (pbVar27[4] = (char)(*pbVar35 << 4) >> 7 & bVar10, uVar13 != 5)) &&
                         (pbVar27[5] = (char)(*pbVar35 << 5) >> 7 & bVar10, uVar13 == 7)) {
                        pbVar27[6] = (char)(*pbVar35 << 6) >> 7 & bVar10;
                      }
                    }
                    if (a_00 != out_n) {
                      psVar6 = a->out;
                      if (a_00 == 1) {
                        lVar16 = lVar15;
                        if (-1 < (int)uVar20) {
                          do {
                            psVar6[lVar16 * 2 + (uVar23 - 1)] = 0xff;
                            psVar6[lVar16 * 2 + (uVar23 - 2)] = psVar6[lVar16 + (uVar23 - 1)];
                            lVar36 = lVar16 + -1;
                            bVar37 = 0 < lVar16;
                            lVar16 = lVar36;
                          } while (lVar36 != 0 && bVar37);
                        }
                      }
                      else {
                        if (a_00 != 3) {
                          __assert_fail("img_n == 3",
                                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                                        ,0x1275,
                                        "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                       );
                        }
                        if (-1 < (int)uVar20) {
                          psVar34 = psVar6 + (ulong)uVar20 * 3 + 2 + uVar23;
                          lVar16 = lVar15;
                          do {
                            psVar6[lVar16 * 4 + (uVar23 - 1)] = 0xff;
                            psVar6[lVar16 * 4 + (uVar23 - 2)] = *psVar34;
                            psVar6[lVar16 * 4 + (uVar23 - 3)] = psVar34[-1];
                            psVar6[lVar16 * 4 + (uVar23 - 4)] = psVar34[-2];
                            psVar34 = psVar34 + -3;
                            lVar36 = lVar16 + -1;
                            bVar37 = 0 < lVar16;
                            lVar16 = lVar36;
                          } while (lVar36 != 0 && bVar37);
                        }
                      }
                    }
                    uVar31 = uVar31 + 1;
                    uVar4 = uVar4 + uVar3;
                  } while (uVar31 != uVar8);
                  return 1;
                }
                goto joined_r0x0014461a;
              }
            }
            else {
              if (iVar11 != out_n) {
                __assert_fail("img_n+1 == out_n",
                              "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                              ,0x121c,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              switch(bVar10) {
              case 0:
                if (iVar5 != 0) {
                  iVar32 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar23 = 0;
                      do {
                        psVar34[uVar23] = raw[uVar23];
                        uVar23 = uVar23 + 1;
                      } while (uVar4 != uVar23);
                    }
                    psVar34[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar34 = psVar34 + lVar15;
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                }
                break;
              case 1:
                if (iVar5 != 0) {
                  psVar6 = psVar6 + lVar22 + lVar16;
                  iVar32 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar23 = 0;
                      do {
                        psVar34[uVar23] = psVar6[uVar23] + raw[uVar23];
                        uVar23 = uVar23 + 1;
                      } while (uVar4 != uVar23);
                    }
                    psVar34[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar34 = psVar34 + lVar15;
                    psVar6 = psVar6 + lVar15;
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                }
                break;
              case 2:
                if (iVar5 != 0) {
                  iVar32 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar23 = 0;
                      do {
                        psVar34[uVar23] = psVar34[uVar23 + lVar30] + raw[uVar23];
                        uVar23 = uVar23 + 1;
                      } while (uVar4 != uVar23);
                    }
                    psVar34[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar34 = psVar34 + lVar15;
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                }
                break;
              case 3:
                if (iVar5 != 0) {
                  iVar32 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar23 = 0;
                      psVar6 = psVar34;
                      do {
                        *psVar6 = (char)((uint)psVar6[lVar16] + (uint)psVar6[lVar30] >> 1) +
                                  raw[uVar23];
                        uVar23 = uVar23 + 1;
                        psVar6 = psVar6 + 1;
                      } while (uVar4 != uVar23);
                    }
                    psVar34[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar34 = psVar34 + lVar15;
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                }
                break;
              case 4:
                if (iVar5 != 0) {
                  psVar18 = psVar6 + lVar22 + lVar30;
                  psVar24 = psVar6 + lVar22 + lVar16;
                  psVar6 = psVar6 + lVar22 + (lVar16 - (ulong)uVar3);
                  iVar32 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar23 = 0;
                      do {
                        bVar10 = psVar24[uVar23];
                        bVar9 = psVar18[uVar23];
                        bVar28 = psVar6[uVar23];
                        iVar26 = ((uint)bVar9 + (uint)bVar10) - (uint)bVar28;
                        uVar19 = iVar26 - (uint)bVar10;
                        uVar13 = -uVar19;
                        if (0 < (int)uVar19) {
                          uVar13 = uVar19;
                        }
                        uVar25 = iVar26 - (uint)bVar9;
                        uVar19 = -uVar25;
                        if (0 < (int)uVar25) {
                          uVar19 = uVar25;
                        }
                        uVar29 = iVar26 - (uint)bVar28;
                        uVar25 = -uVar29;
                        if (0 < (int)uVar29) {
                          uVar25 = uVar29;
                        }
                        if (uVar19 <= uVar25) {
                          bVar28 = bVar9;
                        }
                        if (uVar25 < uVar13) {
                          bVar10 = bVar28;
                        }
                        if (uVar19 < uVar13) {
                          bVar10 = bVar28;
                        }
                        psVar34[uVar23] = bVar10 + raw[uVar23];
                        uVar23 = uVar23 + 1;
                      } while (uVar4 != uVar23);
                    }
                    psVar34[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar34 = psVar34 + lVar15;
                    psVar18 = psVar18 + lVar15;
                    psVar24 = psVar24 + lVar15;
                    psVar6 = psVar6 + lVar15;
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                }
                break;
              case 5:
                if (iVar5 != 0) {
                  psVar6 = psVar6 + lVar22 + lVar16;
                  iVar32 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar23 = 0;
                      do {
                        psVar34[uVar23] = (psVar6[uVar23] >> 1) + raw[uVar23];
                        uVar23 = uVar23 + 1;
                      } while (uVar4 != uVar23);
                    }
                    psVar34[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar34 = psVar34 + lVar15;
                    psVar6 = psVar6 + lVar15;
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                }
                break;
              case 6:
                if (iVar5 != 0) {
                  psVar6 = psVar6 + lVar22 + lVar16;
                  iVar32 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar23 = 0;
                      do {
                        psVar34[uVar23] = psVar6[uVar23] + raw[uVar23];
                        uVar23 = uVar23 + 1;
                      } while (uVar4 != uVar23);
                    }
                    psVar34[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar34 = psVar34 + lVar15;
                    psVar6 = psVar6 + lVar15;
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                }
              }
              if (depth != 0x10) goto LAB_00144d06;
              if (x != 0) {
                psVar6 = a->out + (long)(int)uVar4 + uVar31 + 1;
                uVar31 = (ulong)x;
                do {
                  *psVar6 = 0xff;
                  psVar6 = psVar6 + lVar15;
                  uVar13 = (int)uVar31 - 1;
                  uVar31 = (ulong)uVar13;
                } while (uVar13 != 0);
                goto LAB_00144d06;
              }
              if (lVar36 + 1U == uVar8) goto LAB_0014461c;
            }
            lVar36 = lVar36 + 1;
            uVar31 = (ulong)(uVar3 * (int)lVar36);
            psVar6 = a->out + uVar31;
            bVar10 = *raw;
          } while (bVar10 < 5);
        }
        pcVar7 = "invalid filter";
      }
    }
  }
LAB_001445ed:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar7;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }